

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

void __thiscall CCNR::ls_solver::clear_prev_data(ls_solver *this)

{
  pointer piVar1;
  pointer piVar2;
  
  piVar1 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->_index_in_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->_index_in_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
  }
  piVar1 = (this->_index_in_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->_index_in_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
    return;
  }
  return;
}

Assistant:

void ls_solver::clear_prev_data()
{
    _unsat_clauses.clear();
    vector<int>().swap(_unsat_clauses);
    _ccd_vars.clear();
    vector<int>().swap(_ccd_vars);
    _unsat_vars.clear();
    vector<int>().swap(_unsat_vars);
    for (int &item : _index_in_unsat_clauses) item = 0;
    for (int &item : _index_in_unsat_vars) item = 0;
}